

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frattracer.cpp
# Opt level: O0

void __thiscall
CaDiCaL::FratTracer::frat_delete_clause
          (FratTracer *this,uint64_t id,vector<int,_std::allocator<int>_> *clause)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator this_01;
  File *in_RDX;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_RDI;
  int *external_lit;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  File *in_stack_ffffffffffffffc8;
  FratTracer *in_stack_ffffffffffffffd0;
  uint64_t in_stack_ffffffffffffffe0;
  
  if (((ulong)in_RDI[3]._M_current & 1) == 0) {
    File::put(in_stack_ffffffffffffffc8,(char *)in_RDI);
  }
  else {
    File::put(in_stack_ffffffffffffffc8,(char)((ulong)in_RDI >> 0x38));
  }
  if (((ulong)in_RDI[3]._M_current & 1) == 0) {
    File::put(in_RDX,in_stack_ffffffffffffffe0);
    File::put(in_stack_ffffffffffffffc8,(char *)in_RDI);
  }
  else {
    put_binary_id(in_stack_ffffffffffffffd0,(uint64_t)in_stack_ffffffffffffffc8);
  }
  this_00 = std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffffb8);
  this_01 = std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    in_stack_ffffffffffffffc8 =
         (File *)__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                              *)&stack0xffffffffffffffd8);
    if (((ulong)in_RDI[3]._M_current & 1) == 0) {
      File::put((File *)this_00._M_current,(int)((ulong)this_01._M_current >> 0x20));
      File::put(in_stack_ffffffffffffffc8,(char)((ulong)in_RDI >> 0x38));
    }
    else {
      put_binary_lit((FratTracer *)this_01._M_current,
                     (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffffd8);
  }
  if (((ulong)in_RDI[3]._M_current & 1) == 0) {
    File::put(in_stack_ffffffffffffffc8,(char *)in_RDI);
  }
  else {
    put_binary_zero((FratTracer *)0xda1579);
  }
  return;
}

Assistant:

void FratTracer::frat_delete_clause (uint64_t id,
                                     const vector<int> &clause) {
  if (binary)
    file->put ('d');
  else
    file->put ("d ");
  if (binary)
    put_binary_id (id);
  else
    file->put (id), file->put ("  ");
  for (const auto &external_lit : clause)
    if (binary)
      put_binary_lit (external_lit);
    else
      file->put (external_lit), file->put (' ');
  if (binary)
    put_binary_zero ();
  else
    file->put ("0\n");
}